

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_> __thiscall
cmNinjaTargetGenerator::New(cmNinjaTargetGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  unique_ptr<cmNinjaUtilityTargetGenerator,_std::default_delete<cmNinjaUtilityTargetGenerator>_>
  local_30;
  unique_ptr<cmNinjaNormalTargetGenerator,_std::default_delete<cmNinjaNormalTargetGenerator>_>
  local_28;
  unique_ptr<cmNinjaNormalTargetGenerator,_std::default_delete<cmNinjaNormalTargetGenerator>_>
  local_20;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  
  local_18 = target;
  target_local = (cmGeneratorTarget *)this;
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 < UTILITY) {
    std::make_unique<cmNinjaNormalTargetGenerator,cmGeneratorTarget*&>
              ((cmGeneratorTarget **)&local_20);
    std::unique_ptr<cmNinjaTargetGenerator,std::default_delete<cmNinjaTargetGenerator>>::
    unique_ptr<cmNinjaNormalTargetGenerator,std::default_delete<cmNinjaNormalTargetGenerator>,void>
              ((unique_ptr<cmNinjaTargetGenerator,std::default_delete<cmNinjaTargetGenerator>> *)
               this,&local_20);
    std::
    unique_ptr<cmNinjaNormalTargetGenerator,_std::default_delete<cmNinjaNormalTargetGenerator>_>::
    ~unique_ptr(&local_20);
    return (__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
            )(__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
              )this;
  }
  if (1 < TVar2 - UTILITY) {
    if (TVar2 != INTERFACE_LIBRARY) {
      std::unique_ptr<cmNinjaTargetGenerator,std::default_delete<cmNinjaTargetGenerator>>::
      unique_ptr<std::default_delete<cmNinjaTargetGenerator>,void>
                ((unique_ptr<cmNinjaTargetGenerator,std::default_delete<cmNinjaTargetGenerator>> *)
                 this);
      return (__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
              )(__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
                )this;
    }
    bVar1 = cmGeneratorTarget::HaveCxx20ModuleSources(local_18,(string *)0x0);
    if (bVar1) {
      std::make_unique<cmNinjaNormalTargetGenerator,cmGeneratorTarget*&>
                ((cmGeneratorTarget **)&local_28);
      std::unique_ptr<cmNinjaTargetGenerator,std::default_delete<cmNinjaTargetGenerator>>::
      unique_ptr<cmNinjaNormalTargetGenerator,std::default_delete<cmNinjaNormalTargetGenerator>,void>
                ((unique_ptr<cmNinjaTargetGenerator,std::default_delete<cmNinjaTargetGenerator>> *)
                 this,&local_28);
      std::
      unique_ptr<cmNinjaNormalTargetGenerator,_std::default_delete<cmNinjaNormalTargetGenerator>_>::
      ~unique_ptr(&local_28);
      return (__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
              )(__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
                )this;
    }
  }
  std::make_unique<cmNinjaUtilityTargetGenerator,cmGeneratorTarget*&>
            ((cmGeneratorTarget **)&local_30);
  std::unique_ptr<cmNinjaTargetGenerator,std::default_delete<cmNinjaTargetGenerator>>::
  unique_ptr<cmNinjaUtilityTargetGenerator,std::default_delete<cmNinjaUtilityTargetGenerator>,void>
            ((unique_ptr<cmNinjaTargetGenerator,std::default_delete<cmNinjaTargetGenerator>> *)this,
             &local_30);
  std::
  unique_ptr<cmNinjaUtilityTargetGenerator,_std::default_delete<cmNinjaUtilityTargetGenerator>_>::
  ~unique_ptr(&local_30);
  return (__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
          )(__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmNinjaTargetGenerator> cmNinjaTargetGenerator::New(
  cmGeneratorTarget* target)
{
  switch (target->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::OBJECT_LIBRARY:
      return cm::make_unique<cmNinjaNormalTargetGenerator>(target);

    case cmStateEnums::INTERFACE_LIBRARY:
      if (target->HaveCxx20ModuleSources()) {
        return cm::make_unique<cmNinjaNormalTargetGenerator>(target);
      }
      CM_FALLTHROUGH;

    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
      return cm::make_unique<cmNinjaUtilityTargetGenerator>(target);

    default:
      return std::unique_ptr<cmNinjaTargetGenerator>();
  }
}